

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datafile.c
# Opt level: O0

errr parse_file(parser *p,char *filename)

{
  char *pcVar1;
  _Bool _Var2;
  char *pcVar3;
  parser_error local_834;
  ang_file *paStack_830;
  errr r;
  ang_file *fh;
  char buf [1024];
  char path [1024];
  char *filename_local;
  parser *p_local;
  
  pcVar1 = ANGBAND_DIR_USER;
  local_834 = PARSE_ERROR_NONE;
  pcVar3 = format("%s.txt",filename);
  path_build(buf + 0x3f8,0x400,pcVar1,pcVar3);
  paStack_830 = file_open(buf + 0x3f8,MODE_READ,FTYPE_TEXT);
  pcVar1 = ANGBAND_DIR_GAMEDATA;
  if (paStack_830 == (ang_file *)0x0) {
    pcVar3 = format("%s.txt",filename);
    path_build(buf + 0x3f8,0x400,pcVar1,pcVar3);
    paStack_830 = file_open(buf + 0x3f8,MODE_READ,FTYPE_TEXT);
  }
  if (paStack_830 == (ang_file *)0x0) {
    p_local._4_4_ = PARSE_ERROR_NO_FILE_FOUND;
  }
  else {
    do {
      _Var2 = file_getl(paStack_830,(char *)&fh,0x400);
      if (!_Var2) break;
      local_834 = parser_parse(p,(char *)&fh);
    } while (local_834 == PARSE_ERROR_NONE);
    file_close(paStack_830);
    p_local._4_4_ = local_834;
  }
  return p_local._4_4_;
}

Assistant:

errr parse_file(struct parser *p, const char *filename) {
	char path[1024];
	char buf[1024];
	ang_file *fh;
	errr r = 0;

	/* The player can put a customised file in the user directory */
	path_build(path, sizeof(path), ANGBAND_DIR_USER, format("%s.txt",
															filename));
	fh = file_open(path, MODE_READ, FTYPE_TEXT);

	/* If no custom file, just load the standard one */
	if (!fh) {
		path_build(path, sizeof(path), ANGBAND_DIR_GAMEDATA,
				   format("%s.txt", filename));
		fh = file_open(path, MODE_READ, FTYPE_TEXT);
	}

	/* File wasn't found, return the error */
	if (!fh)
		return PARSE_ERROR_NO_FILE_FOUND;

	/* Parse it */
	while (file_getl(fh, buf, sizeof(buf))) {
		r = parser_parse(p, buf);
		if (r)
			break;
	}
	file_close(fh);
	return r;
}